

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_await.c
# Opt level: O2

int mpt_connection_await(mpt_connection *con,_func_int_void_ptr_mpt_message_ptr *ctl,void *udata)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint32_t *puVar4;
  byte bVar5;
  
  if (((con->out).sock._id < 0) && ((con->out).buf._buf == (mpt_buffer *)0x0)) {
    iVar3 = -1;
  }
  else {
    iVar3 = -4;
    if ((con->cid == 0) && (((con->out).state & 0x10) == 0)) {
      bVar2 = (con->out)._idlen;
      bVar5 = 4;
      if (bVar2 < 4) {
        bVar5 = bVar2;
      }
      puVar4 = (uint32_t *)mpt_command_reserve(&con->_wait,bVar5,udata,bVar5);
      if (puVar4 == (uint32_t *)0x0) {
        iVar3 = -2;
      }
      else {
        puVar1 = &(con->out).state;
        *puVar1 = *puVar1 | 0x40;
        con->cid = *puVar4;
        if (ctl != (_func_int_void_ptr_mpt_message_ptr *)0x0) {
          *(_func_int_void_ptr_mpt_message_ptr **)(puVar4 + 2) = ctl;
          *(void **)(puVar4 + 4) = udata;
        }
        iVar3 = (int)(((long)puVar4 + (-8 - (long)(con->_wait)._buf)) / 0x18);
      }
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_connection_await(MPT_STRUCT(connection) *con, int (*ctl)(void *, const MPT_STRUCT(message) *), void *udata)
{
	MPT_STRUCT(command) *cmd;
	size_t max;
	
	/* no socket or stream open */
	if (!MPT_socket_active(&con->out.sock) && !(con->out.buf._buf)) {
		return MPT_ERROR(BadArgument);
	}
	/* message in progress */
	if (con->cid || (con->out.state & MPT_OUTFLAG(Active))) {
		return MPT_ERROR(BadOperation);
	}
	if ((max = con->out._idlen) > sizeof(con->cid)) {
		max = sizeof(con->cid);
	}
	if (!(cmd = mpt_command_reserve(&con->_wait, max))) {
		return MPT_ERROR(BadValue);
	}
	/* make next message non-local */
	con->out.state |= MPT_OUTFLAG(Remote);
	con->cid = cmd->id;
	
	if (ctl) {
		cmd->cmd = (int (*)()) ctl;
		cmd->arg = udata;
	}
	return 1 + cmd - ((MPT_STRUCT(command) *) (con->_wait._buf + 1));
}